

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

bool __thiscall
crnlib::dxt1_endpoint_optimizer::try_alpha_as_black_optimization(dxt1_endpoint_optimizer *this)

{
  bool bVar1;
  results *prVar2;
  uint uVar3;
  unique_color *puVar4;
  byte *pbVar5;
  color_quad<unsigned_char,_int> *pcVar6;
  uchar *puVar7;
  color_quad<unsigned_char,_int> *local_140;
  uint local_c4;
  ulong uStack_c0;
  uint i_2;
  uint64 trial_error;
  color_quad_u8 c [4];
  vector<unsigned_char> trial_selectors;
  results trial_results;
  uint i_1;
  undefined1 local_68 [8];
  vector<crnlib::color_quad<unsigned_char,_int>_> trial_colors;
  params trial_params;
  uint local_28;
  uint local_24;
  uint i;
  uint num_dark_colors;
  results *pOrig_results;
  dxt1_endpoint_optimizer *this_local;
  
  prVar2 = this->m_pResults;
  local_24 = 0;
  for (local_28 = 0; uVar3 = vector<crnlib::unique_color>::size(&this->m_unique_colors),
      local_28 < uVar3; local_28 = local_28 + 1) {
    puVar4 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,local_28);
    pbVar5 = color_quad<unsigned_char,_int>::operator[](&puVar4->m_color,0);
    if (*pbVar5 < 5) {
      puVar4 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,local_28);
      pbVar5 = color_quad<unsigned_char,_int>::operator[](&puVar4->m_color,1);
      if (*pbVar5 < 5) {
        puVar4 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,local_28);
        pbVar5 = color_quad<unsigned_char,_int>::operator[](&puVar4->m_color,2);
        if (*pbVar5 < 5) {
          local_24 = local_24 + 1;
        }
      }
    }
  }
  if ((local_24 != 0) &&
     (uVar3 = vector<crnlib::unique_color>::size(&this->m_unique_colors), local_24 != uVar3)) {
    trial_colors.m_size = this->m_pParams->m_block_index;
    trial_colors.m_capacity = *(uint *)&this->m_pParams->field_0x4;
    vector<crnlib::color_quad<unsigned_char,_int>_>::vector
              ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_68);
    vector<crnlib::color_quad<unsigned_char,_int>_>::insert
              ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_68,0,
               this->m_pParams->m_pPixels,this->m_pParams->m_num_pixels);
    vector<crnlib::color_quad<unsigned_char,_int>_>::get_ptr
              ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_68);
    trial_results.m_alpha_block = false;
    trial_results.m_reordered = false;
    trial_results.m_alternate_rounding = false;
    trial_results.m_enforce_selector = false;
    for (; uVar3 = vector<crnlib::color_quad<unsigned_char,_int>_>::size
                             ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_68),
        (uint)trial_results._24_4_ < uVar3; trial_results._24_4_ = trial_results._24_4_ + 1) {
      pcVar6 = vector<crnlib::color_quad<unsigned_char,_int>_>::operator[]
                         ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_68,
                          trial_results._24_4_);
      pbVar5 = color_quad<unsigned_char,_int>::operator[](pcVar6,0);
      if (*pbVar5 < 5) {
        pcVar6 = vector<crnlib::color_quad<unsigned_char,_int>_>::operator[]
                           ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_68,
                            trial_results._24_4_);
        pbVar5 = color_quad<unsigned_char,_int>::operator[](pcVar6,1);
        if (*pbVar5 < 5) {
          pcVar6 = vector<crnlib::color_quad<unsigned_char,_int>_>::operator[]
                             ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_68,
                              trial_results._24_4_);
          pbVar5 = color_quad<unsigned_char,_int>::operator[](pcVar6,2);
          if (*pbVar5 < 5) {
            pcVar6 = vector<crnlib::color_quad<unsigned_char,_int>_>::operator[]
                               ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_68,
                                trial_results._24_4_);
            puVar7 = color_quad<unsigned_char,_int>::operator[](pcVar6,3);
            *puVar7 = '\0';
          }
        }
      }
    }
    results::results((results *)&trial_selectors.m_size);
    vector<unsigned_char>::vector((vector<unsigned_char> *)(c + 2),this->m_pParams->m_num_pixels);
    puVar7 = vector<unsigned_char>::get_ptr((vector<unsigned_char> *)(c + 2));
    compute_internal(this,(params *)&trial_colors.m_size,(results *)&trial_selectors.m_size);
    local_140 = (color_quad<unsigned_char,_int> *)&trial_error;
    do {
      color_quad<unsigned_char,_int>::color_quad(local_140);
      local_140 = local_140 + 1;
    } while (local_140 != c + 2);
    dxt1_block::get_block_colors3
              ((color_quad_u8 *)&trial_error,(uint16)trial_results.m_error,
               trial_results.m_error._2_2_);
    uStack_c0 = 0;
    for (local_c4 = 0;
        uVar3 = vector<crnlib::color_quad<unsigned_char,_int>_>::size
                          ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_68),
        local_c4 < uVar3; local_c4 = local_c4 + 1) {
      pcVar6 = vector<crnlib::color_quad<unsigned_char,_int>_>::operator[]
                         ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_68,local_c4);
      color_quad<unsigned_char,_int>::operator[](pcVar6,3);
      bVar1 = this->m_perceptual;
      pcVar6 = vector<crnlib::color_quad<unsigned_char,_int>_>::operator[]
                         ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_68,local_c4);
      pbVar5 = vector<unsigned_char>::operator[]((vector<unsigned_char> *)(c + 2),local_c4);
      uVar3 = color_distance(this,(bool)(bVar1 & 1),pcVar6,c + ((ulong)*pbVar5 - 2),false);
      uStack_c0 = uVar3 + uStack_c0;
    }
    if (uStack_c0 < prVar2->m_error) {
      prVar2->m_error = uStack_c0;
      prVar2->m_low_color = (uint16)trial_results.m_error;
      prVar2->m_high_color = trial_results.m_error._2_2_;
      if (prVar2->m_pSelectors != (uint8 *)0x0) {
        memcpy(prVar2->m_pSelectors,puVar7,(ulong)this->m_pParams->m_num_pixels);
      }
      prVar2->m_alpha_block = true;
    }
    vector<unsigned_char>::~vector((vector<unsigned_char> *)(c + 2));
    vector<crnlib::color_quad<unsigned_char,_int>_>::~vector
              ((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_68);
  }
  return true;
}

Assistant:

bool dxt1_endpoint_optimizer::try_alpha_as_black_optimization()
    {
        results* pOrig_results = m_pResults;

        uint num_dark_colors = 0;

        for (uint i = 0; i < m_unique_colors.size(); i++)
        {
            if ((m_unique_colors[i].m_color[0] <= 4) && (m_unique_colors[i].m_color[1] <= 4) && (m_unique_colors[i].m_color[2] <= 4))
            {
                num_dark_colors++;
            }
        }

        if ((!num_dark_colors) || (num_dark_colors == m_unique_colors.size()))
        {
            return true;
        }

        params trial_params(*m_pParams);
        crnlib::vector<color_quad_u8> trial_colors;
        trial_colors.insert(0, m_pParams->m_pPixels, m_pParams->m_num_pixels);

        trial_params.m_pPixels = trial_colors.get_ptr();
        trial_params.m_pixels_have_alpha = true;

        for (uint i = 0; i < trial_colors.size(); i++)
        {
            if ((trial_colors[i][0] <= 4) && (trial_colors[i][1] <= 4) && (trial_colors[i][2] <= 4))
            {
                trial_colors[i][3] = 0;
            }
        }

        results trial_results;

        crnlib::vector<uint8> trial_selectors(m_pParams->m_num_pixels);
        trial_results.m_pSelectors = trial_selectors.get_ptr();

        compute_internal(trial_params, trial_results);

        CRNLIB_ASSERT(trial_results.m_alpha_block);

        color_quad_u8 c[4];
        dxt1_block::get_block_colors3(c, trial_results.m_low_color, trial_results.m_high_color);

        uint64 trial_error = 0;

        for (uint i = 0; i < trial_colors.size(); i++)
        {
            if (trial_colors[i][3] == 0)
            {
                CRNLIB_ASSERT(trial_selectors[i] == 3);
            }
            else
            {
                CRNLIB_ASSERT(trial_selectors[i] != 3);
            }

            trial_error += color_distance(m_perceptual, trial_colors[i], c[trial_selectors[i]], false);
        }

        if (trial_error < pOrig_results->m_error)
        {
            pOrig_results->m_error = trial_error;

            pOrig_results->m_low_color = trial_results.m_low_color;
            pOrig_results->m_high_color = trial_results.m_high_color;

            if (pOrig_results->m_pSelectors)
            {
                memcpy(pOrig_results->m_pSelectors, trial_results.m_pSelectors, m_pParams->m_num_pixels);
            }

            pOrig_results->m_alpha_block = true;
        }

        return true;
    }